

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * GetString(ConfigScanner *sc)

{
  byte firstbyte;
  byte *__src;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  byte *pbVar4;
  size_t __n;
  
  if (sc != (ConfigScanner *)0x0) {
    __src = (byte *)sc->ptr;
    pbVar4 = __src;
    do {
      firstbyte = *pbVar4;
      iVar1 = 3;
      if (((0x3d < (ulong)firstbyte) ||
          ((0x2800000d00002601U >> ((ulong)firstbyte & 0x3f) & 1) == 0)) && (firstbyte != 0x5d)) {
        sVar2 = GetUTF8Length(firstbyte);
        if (sVar2 == 0) {
          iVar1 = 1;
        }
        else {
          pbVar4 = pbVar4 + sVar2;
          sc->ptr = (char *)pbVar4;
          iVar1 = 0;
        }
      }
    } while (iVar1 == 0);
    if ((iVar1 == 3) && (__n = (long)sc->ptr - (long)__src, __n != 0)) {
      pcVar3 = (char *)malloc(__n + 1);
      memset(pcVar3,0,__n + 1);
      pcVar3 = strncpy(pcVar3,(char *)__src,__n);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char *GetString(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return NULL;
	}
	char *start = sc->ptr;
	while (true)
	{
		char ch = *sc->ptr;
		if ((ch == ' ') || (ch == '\t'))
		{
			break;
		}
		if ((ch == '\r') || (ch == '\n') || (ch == '\0'))
		{
			break;
		}
		if ((ch == ']') | (ch == '=') || (ch == '"'))
		{
			break;
		}
		if ((ch == '#') || (ch == ';'))
		{
			break;
		}
		size_t step = GetUTF8Length(ch);
		if (step == 0)
		{
			return NULL;
		}
		sc->ptr += step;
	}
	size_t length = sc->ptr - start;
	if (length == 0)
	{
		return NULL;
	}
	char *temp = (char *)malloc(length + 1);
	memset(temp, '\0', length + 1);
	strncpy(temp, start, length);
	return temp;
}